

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::iterate
          (TestStatus *__return_storage_ptr__,
          DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  qpTestResult code;
  bool bVar3;
  VkResult VVar4;
  TestContext *this_00;
  TestLog *log_00;
  VkQueue queue_00;
  Buffer *this_01;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)18> *pHVar6;
  pointer pPVar7;
  Image *this_02;
  Allocator *allocator;
  char *__s;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  allocator<char> local_219;
  string local_218;
  ConstPixelBufferAccess local_1f8;
  qpTestResult local_1cc;
  void *pvStack_1c8;
  qpTestResult res;
  deInt32 local_1c0;
  undefined1 local_1b8 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_158;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_150;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_148;
  __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_140;
  const_iterator vertex;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  PixelBufferAccess local_e8;
  TextureFormat local_c0;
  undefined1 local_b8 [8];
  TextureLevel refImage;
  undefined8 uStack_88;
  VkSubmitInfo submitInfo;
  deUint64 local_38;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkQueue queue;
  TestLog *log;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this_local;
  
  this_00 = Context::getTestContext((this->super_DrawTestInstanceBase).super_TestInstance.m_context)
  ;
  log_00 = tcu::TestContext::getLog(this_00);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestInstanceBase).m_vertexBuffer);
  local_38 = (deUint64)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  this_03 = &(this->super_DrawTestInstanceBase).m_cmdBuffer;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar5,0,1,&local_38,&vertexBuffer);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DrawTestInstanceBase).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar6->m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,submitInfo.pSignalSemaphores);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,*ppVVar5,(ulong)*(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c,
             (ulong)*(uint *)&(this->m_data).field_0x20,(ulong)*(uint *)&(this->m_data).field_0x24,
             (ulong)*(uint *)&(this->m_data).field_0x28);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar5);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar5);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_88 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)&refImage.m_data.m_cap,0);
  VVar4 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue_00,1,&uStack_88,refImage.m_data.m_cap);
  ::vk::checkResult(VVar4,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x29f);
  local_c0 = ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_b8,&local_c0,0x100,0x100,1);
  tcu::TextureLevel::getAccess(&local_e8,(TextureLevel *)local_b8);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0.0,0.0,0.0,1.0);
  tcu::clear(&local_e8,
             (Vec4 *)((long)&vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertex);
  local_150._M_current =
       (PositionColorVertex *)
       std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
       ::begin((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                *)&this->m_data);
  local_148 = __gnu_cxx::
              __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
              ::operator+(&local_150,(ulong)*(uint *)&(this->m_data).field_0x24);
  __gnu_cxx::
  __normal_iterator<vkt::Draw::PositionColorVertex_const*,std::vector<vkt::Draw::PositionColorVertex,std::allocator<vkt::Draw::PositionColorVertex>>>
  ::__normal_iterator<vkt::Draw::PositionColorVertex*>
            ((__normal_iterator<vkt::Draw::PositionColorVertex_const*,std::vector<vkt::Draw::PositionColorVertex,std::allocator<vkt::Draw::PositionColorVertex>>>
              *)&local_140,&local_148);
  while( true ) {
    local_158._M_current =
         (PositionColorVertex *)
         std::
         vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
         end((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
              *)&this->m_data);
    bVar3 = __gnu_cxx::operator!=(&local_140,&local_158);
    if (!bVar3) break;
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
             ::operator->(&local_140);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&pPVar7->position);
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
             ::operator->(&local_140);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertex,
               &pPVar7->color);
    __gnu_cxx::
    __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
    ::operator++(&local_140);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&zeroOffset.z,(TextureLevel *)local_b8);
  DrawTestInstanceBase::generateRefImage
            (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&zeroOffset.z,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertex);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  VVar4 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue_00);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x2af);
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestInstanceBase).m_colorTargetImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  local_1c0 = zeroOffset.x;
  pvStack_1c8 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_1b8,this_02,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_1cc = QP_TEST_RESULT_PASS;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_1f8,(TextureLevel *)local_b8);
  bVar3 = imageCompare(log_00,&local_1f8,(ConstPixelBufferAccess *)local_1b8,
                       (this->m_data).super_DrawParamsBase.topology);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    local_1cc = QP_TEST_RESULT_FAIL;
  }
  code = local_1cc;
  __s = qpGetTestResultName(local_1cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s,&local_219);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertex);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawParams>::iterate (void)
{
	tcu::TestLog			&log				= m_context.getTestContext().getLog();
	const vk::VkQueue		queue				= m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	m_vk.cmdDraw(*m_cmdBuffer, m_data.params.vertexCount, m_data.params.instanceCount, m_data.params.firstVertex, m_data.params.firstInstance);
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	std::vector<tcu::Vec4>	vertices;
	std::vector<tcu::Vec4>	colors;

	for (std::vector<PositionColorVertex>::const_iterator vertex = m_data.vertices.begin() + m_data.params.firstVertex; vertex != m_data.vertices.end(); ++vertex)
	{
		vertices.push_back(vertex->position);
		colors.push_back(vertex->color);
	}
	generateRefImage(refImage.getAccess(), vertices, colors);

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}